

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

bool __thiscall leveldb::anon_unknown_0::LRUCache::FinishErase(LRUCache *this,LRUHandle *e)

{
  long lVar1;
  LRUCache *in_RSI;
  LRUHandle *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (LRUCache *)0x0) {
    if (((ulong)(in_RSI->lru_).value & 1) == 0) {
      __assert_fail("e->in_cache",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                    ,0x135,"bool leveldb::(anonymous namespace)::LRUCache::FinishErase(LRUHandle *)"
                   );
    }
    LRU_Remove((LRUCache *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
               (LRUHandle *)0xd4c2a9);
    *(undefined1 *)&(in_RSI->lru_).value = 0;
    in_RDI->key_length =
         in_RDI->key_length -
         (long)(in_RSI->mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next;
    Unref(in_RSI,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RSI != (LRUCache *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool LRUCache::FinishErase(LRUHandle* e) {
  if (e != nullptr) {
    assert(e->in_cache);
    LRU_Remove(e);
    e->in_cache = false;
    usage_ -= e->charge;
    Unref(e);
  }
  return e != nullptr;
}